

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.hpp
# Opt level: O3

type __thiscall
PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)2>
          (Memory *this,Source segment,uint16_t offset)

{
  uint uVar1;
  Segments *pSVar2;
  uint uVar3;
  int iVar4;
  undefined7 in_register_00000031;
  Segments *pSVar5;
  
  pSVar2 = this->segments_;
  iVar4 = (int)CONCAT71(in_register_00000031,segment);
  pSVar5 = pSVar2;
  if (iVar4 != 8) {
    if (iVar4 == 9) {
      pSVar5 = (Segments *)&pSVar2->cs_base_;
    }
    else if (iVar4 == 10) {
      pSVar5 = (Segments *)&pSVar2->ss_base_;
    }
    else {
      pSVar5 = (Segments *)&pSVar2->ds_base_;
    }
  }
  uVar3 = pSVar5->es_base_ + (uint)offset & 0xfffff;
  if (offset == 0xffff) {
    if (segment != ES) {
      if (segment == CS) {
        pSVar2 = (Segments *)&pSVar2->cs_base_;
      }
      else if (segment == SS) {
        pSVar2 = (Segments *)&pSVar2->ss_base_;
      }
      else {
        pSVar2 = (Segments *)&pSVar2->ds_base_;
      }
    }
    uVar1 = pSVar2->es_base_ & 0xfffff;
    this->write_back_address_[0] = uVar3;
    this->write_back_address_[1] = uVar1;
    this->write_back_value_ =
         CONCAT11((this->memory)._M_elems[uVar1],(this->memory)._M_elems[uVar3]);
  }
  else {
    if (uVar3 != 0xfffff) {
      return (type)((this->memory)._M_elems + uVar3);
    }
    this->write_back_address_[0] = 0xfffff;
    this->write_back_address_[1] = 0;
    this->write_back_value_ =
         (ushort)(*(int *)(this->memory)._M_elems << 8) | (ushort)(this->memory)._M_elems[0xfffff];
  }
  return &this->write_back_value_;
}

Assistant:

typename InstructionSet::x86::Accessor<IntT, type>::type access(InstructionSet::x86::Source segment, uint16_t offset) {
			const uint32_t physical_address = address(segment, offset);

			if constexpr (std::is_same_v<IntT, uint16_t>) {
				// If this is a 16-bit access that runs past the end of the segment, it'll wrap back
				// to the start. So the 16-bit value will need to be a local cache.
				if(offset == 0xffff) {
					return split_word<type>(physical_address, address(segment, 0));
				}
			}

			return access<IntT, type>(physical_address);
		}